

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

btScalar gjkepa2_impl::GJK::projectorigin(btVector3 *a,btVector3 *b,btVector3 *c,btScalar *w,U *m)

{
  uint uVar1;
  btVector3 *a_00;
  long lVar2;
  byte bVar3;
  btScalar bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btScalar subw [2];
  U subm;
  btVector3 *vt [3];
  btVector3 dl [3];
  btScalar local_148 [2];
  float local_140;
  U local_13c;
  U *local_138;
  btVector3 *local_130;
  btVector3 *local_128;
  btVector3 *local_120;
  btVector3 *local_118 [4];
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [4];
  float afStack_64 [3];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_118[0] = a;
  local_118[1] = b;
  local_118[2] = c;
  fVar5 = (float)*(undefined8 *)a->m_floats;
  fVar11 = (float)((ulong)*(undefined8 *)a->m_floats >> 0x20);
  fVar10 = (float)*(undefined8 *)b->m_floats;
  local_e8 = (float)((ulong)*(undefined8 *)b->m_floats >> 0x20);
  fVar12 = fVar5 - fVar10;
  fStack_84 = fVar11 - local_e8;
  fVar9 = a->m_floats[2] - b->m_floats[2];
  unique0x100000a9 = fStack_84;
  local_68 = fVar12;
  unique0x100000ad = fVar9;
  unique0x100000b1 = 0;
  fVar6 = (float)*(undefined8 *)c->m_floats;
  fVar7 = (float)((ulong)*(undefined8 *)c->m_floats >> 0x20);
  fVar10 = fVar10 - fVar6;
  local_e8 = local_e8 - fVar7;
  fVar8 = b->m_floats[2] - c->m_floats[2];
  local_58._4_4_ = local_e8;
  local_58._0_4_ = fVar10;
  local_58._8_4_ = fVar8;
  local_58._12_4_ = 0;
  fVar6 = fVar6 - fVar5;
  fVar7 = fVar7 - fVar11;
  fVar5 = c->m_floats[2] - a->m_floats[2];
  local_a8 = ZEXT416((uint)fVar5);
  local_b8 = CONCAT44(fVar7,fVar6);
  uStack_b0 = 0;
  local_48._4_4_ = fVar7;
  local_48._0_4_ = fVar6;
  local_48._8_4_ = fVar5;
  local_48._12_4_ = 0;
  fVar11 = fStack_84 * fVar8 - local_e8 * fVar9;
  local_c8 = ZEXT416((uint)fVar8);
  local_d8 = CONCAT44(local_e8,fVar10);
  uStack_d0 = 0;
  fVar5 = fVar9 * fVar10 - fVar8 * fVar12;
  fVar6 = fVar12 * local_e8 - fVar10 * fStack_84;
  fVar7 = fVar6 * fVar6 + fVar11 * fVar11 + fVar5 * fVar5;
  if (fVar7 <= 0.0) {
    local_140 = -1.0;
  }
  else {
    local_f8 = CONCAT44(fStack_84,fVar7);
    uStack_f0 = 0;
    fStack_e4 = local_e8;
    fStack_e0 = local_e8;
    fStack_dc = local_e8;
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_13c = 0;
    local_140 = -1.0;
    lVar2 = 0;
    bVar3 = 0;
    local_78 = ZEXT416((uint)fVar5);
    local_88 = fVar11;
    fStack_80 = fStack_84;
    fStack_7c = fStack_84;
    local_98 = CONCAT44(fStack_84,fVar6);
    uStack_90 = 0;
    local_138 = m;
    local_130 = a;
    local_128 = b;
    local_120 = c;
    do {
      a_00 = *(btVector3 **)((long)local_118 + lVar2 * 2);
      if (0.0 < (*(float *)(local_68 + lVar2 * 4) * fVar5 -
                fVar11 * *(float *)(local_68 + lVar2 * 4 + 4)) * a_00->m_floats[2] +
                (*(float *)(local_68 + lVar2 * 4 + 4) * fVar6 -
                fVar5 * *(float *)(local_68 + lVar2 * 4 + 8)) * a_00->m_floats[0] +
                (*(float *)(local_68 + lVar2 * 4 + 8) * fVar11 -
                fVar6 * *(float *)(local_68 + lVar2 * 4)) * a_00->m_floats[1]) {
        uVar1 = *(uint *)((long)projectorigin::imd3 + lVar2);
        bVar4 = projectorigin(a_00,local_118[uVar1],local_148,&local_13c);
        fVar5 = (float)local_78._0_4_;
        fVar11 = local_88;
        fVar6 = (float)local_98;
        if ((local_140 < 0.0) || (bVar4 < local_140)) {
          *local_138 = (1 << ((byte)uVar1 & 0x1f) & (int)(local_13c << 0x1e) >> 0x1f) +
                       (1 << (bVar3 & 0x1f) & -(local_13c & 1));
          *(btScalar *)((long)w + lVar2) = local_148[0];
          w[uVar1] = local_148[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          local_140 = bVar4;
        }
      }
      bVar3 = bVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0xc);
    if (local_140 < 0.0) {
      fVar10 = (local_130->m_floats[2] * fVar6 +
               local_130->m_floats[0] * fVar11 + local_130->m_floats[1] * fVar5) / (float)local_f8;
      fVar11 = fVar11 * fVar10;
      fVar5 = fVar5 * fVar10;
      fVar10 = fVar10 * fVar6;
      *local_138 = 7;
      fVar7 = local_128->m_floats[0] - fVar11;
      fVar6 = local_128->m_floats[1] - fVar5;
      fVar8 = local_128->m_floats[2] - fVar10;
      fVar9 = local_e8 * fVar8 - fVar6 * (float)local_c8._0_4_;
      fVar8 = (float)local_c8._0_4_ * fVar7 - fVar8 * (float)local_d8;
      fVar6 = fVar6 * (float)local_d8 - fVar7 * local_e8;
      fVar6 = SQRT(fVar6 * fVar6 + fVar9 * fVar9 + fVar8 * fVar8) / SQRT((float)local_f8);
      *w = fVar6;
      fVar7 = local_120->m_floats[2] - fVar10;
      local_140 = fVar10 * fVar10 + fVar11 * fVar11 + fVar5 * fVar5;
      fVar11 = local_120->m_floats[0] - fVar11;
      fVar5 = local_120->m_floats[1] - fVar5;
      fVar8 = local_b8._4_4_ * fVar7 - fVar5 * (float)local_a8._0_4_;
      fVar7 = (float)local_a8._0_4_ * fVar11 - fVar7 * (float)local_b8;
      fVar5 = fVar5 * (float)local_b8 - local_b8._4_4_ * fVar11;
      fVar5 = SQRT(fVar5 * fVar5 + fVar8 * fVar8 + fVar7 * fVar7) / SQRT((float)local_f8);
      w[1] = fVar5;
      w[2] = 1.0 - (fVar5 + fVar6);
    }
  }
  return local_140;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c};
				const btVector3		dl[]={a-b,b-c,c-a};
				const btVector3		n=btCross(dl[0],dl[1]);
				const btScalar		l=n.length2();
				if(l>GJK_SIMPLEX3_EPS)
				{
					btScalar	mindist=-1;
					btScalar	subw[2]={0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						if(btDot(*vt[i],btCross(dl[i],n))>0)
						{
							const U			j=imd3[i];
							const btScalar	subd(projectorigin(*vt[i],*vt[j],subw,subm));
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>(((subm&1)?1<<i:0)+((subm&2)?1<<j:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;				
							}
						}
					}
					if(mindist<0)
					{
						const btScalar	d=btDot(a,n);	
						const btScalar	s=btSqrt(l);
						const btVector3	p=n*(d/l);
						mindist	=	p.length2();
						m		=	7;
						w[0]	=	(btCross(dl[1],b-p)).length()/s;
						w[1]	=	(btCross(dl[2],c-p)).length()/s;
						w[2]	=	1-(w[0]+w[1]);
					}
					return(mindist);
				}
				return(-1);
			}